

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O0

void Gia_RsbAddSideInputs(Gia_Man_t *p,Vec_Wec_t *vLevels,Vec_Int_t *vWin)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  int local_44;
  int iObj;
  int f;
  int i;
  int k;
  Gia_Obj_t *pFanout;
  Gia_Obj_t *pObj;
  Vec_Int_t *vLevel;
  Vec_Int_t *vWin_local;
  Vec_Wec_t *vLevels_local;
  Gia_Man_t *p_local;
  
  iVar1 = Vec_WecSizeSize(vLevels);
  if (iVar1 != 0) {
    __assert_fail("Vec_WecSizeSize(vLevels) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                  ,0x368,"void Gia_RsbAddSideInputs(Gia_Man_t *, Vec_Wec_t *, Vec_Int_t *)");
  }
  iObj = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vWin);
    if (iVar1 <= iObj) {
      for (f = 0; iVar1 = Vec_WecSize(vLevels), f < iVar1; f = f + 1) {
        pVVar3 = Vec_WecEntry(vLevels,f);
        iObj = 0;
        while( true ) {
          iVar1 = Vec_IntSize(pVVar3);
          bVar5 = false;
          if (iObj < iVar1) {
            iVar1 = Vec_IntEntry(pVVar3,iObj);
            pFanout = Gia_ManObj(p,iVar1);
            bVar5 = pFanout != (Gia_Obj_t *)0x0;
          }
          if (!bVar5) break;
          for (local_44 = 0;
              (iVar1 = Gia_ObjFanoutNum(p,pFanout), local_44 < iVar1 &&
              (pObj_00 = Gia_ObjFanout(p,pFanout,local_44), local_44 != 5)); local_44 = local_44 + 1
              ) {
            iVar1 = Gia_ObjIsAnd(pObj_00);
            if ((iVar1 != 0) && (iVar1 = Gia_ObjIsTravIdCurrent(p,pObj_00), iVar1 == 0)) {
              pGVar4 = Gia_ObjFanin0(pObj_00);
              iVar1 = Gia_ObjIsTravIdCurrent(p,pGVar4);
              if (iVar1 != 0) {
                pGVar4 = Gia_ObjFanin1(pObj_00);
                iVar1 = Gia_ObjIsTravIdCurrent(p,pGVar4);
                if (iVar1 != 0) {
                  Gia_ObjSetTravIdCurrent(p,pObj_00);
                  iVar1 = Gia_ObjLevel(p,pObj_00);
                  iVar2 = Gia_ObjId(p,pObj_00);
                  Vec_WecPush(vLevels,iVar1,iVar2);
                  iVar1 = Gia_ObjId(p,pObj_00);
                  Vec_IntPush(vWin,iVar1);
                }
              }
            }
          }
          iObj = iObj + 1;
        }
      }
      for (f = 0; iVar1 = Vec_WecSize(vLevels), f < iVar1; f = f + 1) {
        pVVar3 = Vec_WecEntry(vLevels,f);
        Vec_IntClear(pVVar3);
      }
      return;
    }
    iVar1 = Vec_IntEntry(vWin,iObj);
    iVar2 = Gia_ObjIsTravIdCurrentId(p,iVar1);
    if (iVar2 == 0) break;
    iVar2 = Gia_ObjLevelId(p,iVar1);
    Vec_WecPush(vLevels,iVar2,iVar1);
    iObj = iObj + 1;
  }
  __assert_fail("Gia_ObjIsTravIdCurrentId(p, iObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                ,0x36c,"void Gia_RsbAddSideInputs(Gia_Man_t *, Vec_Wec_t *, Vec_Int_t *)");
}

Assistant:

void Gia_RsbAddSideInputs( Gia_Man_t * p, Vec_Wec_t * vLevels, Vec_Int_t * vWin )
{
    Vec_Int_t * vLevel; 
    Gia_Obj_t * pObj, * pFanout;
    int k, i, f, iObj;
    // precondition: the levelized structure is empty
    assert( Vec_WecSizeSize(vLevels) == 0 );
    // precondition: window nodes are labeled with the current ID
    Vec_IntForEachEntry( vWin, iObj, i )
    {
        assert( Gia_ObjIsTravIdCurrentId(p, iObj) );
        Vec_WecPush( vLevels, Gia_ObjLevelId(p, iObj), iObj );
    }
    // iterate through all objects and explore their fanouts
    Vec_WecForEachLevel( vLevels, vLevel, k )
        Gia_ManForEachObjVec( vLevel, p, pObj, i )
            Gia_ObjForEachFanoutStatic( p, pObj, pFanout, f )
            {
                if ( f == 5 ) // explore first 5 fanouts of the node
                    break;
                if ( Gia_ObjIsAnd(pFanout) && // internal node
                    !Gia_ObjIsTravIdCurrent(p, pFanout) && // not in the window
                     Gia_ObjIsTravIdCurrent(p, Gia_ObjFanin0(pFanout)) && // but fanins are
                     Gia_ObjIsTravIdCurrent(p, Gia_ObjFanin1(pFanout)) )  // in the window
                {
                    // add fanout to the window and to the levelized structure
                    Gia_ObjSetTravIdCurrent( p, pFanout );
                    Vec_WecPush( vLevels, Gia_ObjLevel(p, pFanout), Gia_ObjId(p, pFanout) );
                    Vec_IntPush( vWin, Gia_ObjId(p, pFanout) );
                }
            }
    // iterate through the nodes in the levelized structure
    Vec_WecForEachLevel( vLevels, vLevel, k )
        Vec_IntClear( vLevel );
}